

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistwidget.cpp
# Opt level: O0

QListWidgetItem * __thiscall QListWidget::itemFromIndex(QListWidget *this,QModelIndex *index)

{
  bool bVar1;
  QListWidgetPrivate *this_00;
  QListModel *pQVar2;
  QModelIndex *in_RSI;
  QAbstractItemViewPrivate *in_RDI;
  QListWidgetPrivate *d;
  undefined8 local_8;
  int row;
  
  this_00 = d_func((QListWidget *)0x89f2bc);
  bVar1 = QAbstractItemViewPrivate::isIndexValid(in_RDI,in_RSI);
  if (bVar1) {
    pQVar2 = QListWidgetPrivate::listModel((QListWidgetPrivate *)0x89f2e0);
    row = (int)((ulong)pQVar2 >> 0x20);
    QModelIndex::row(in_RSI);
    local_8 = QListModel::at((QListModel *)this_00,row);
  }
  else {
    local_8 = (QListWidgetItem *)0x0;
  }
  return local_8;
}

Assistant:

QListWidgetItem *QListWidget::itemFromIndex(const QModelIndex &index) const
{
    Q_D(const QListWidget);
    if (d->isIndexValid(index))
        return d->listModel()->at(index.row());
    return nullptr;
}